

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.h
# Opt level: O0

FileInfo * __thiscall
llbuild::basic::ChecksumOnlyFileSystem::getFileInfo
          (FileInfo *__return_storage_ptr__,ChecksumOnlyFileSystem *this,string *path)

{
  pointer pFVar1;
  FileInfo *info;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  uint64_t local_28;
  uint64_t local_20;
  string *local_18;
  string *path_local;
  ChecksumOnlyFileSystem *this_local;
  
  local_18 = path;
  path_local = (string *)this;
  pFVar1 = std::
           unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
           ::operator->(&this->impl);
  (*pFVar1->_vptr_FileSystem[7])(__return_storage_ptr__,pFVar1,local_18);
  __return_storage_ptr__->device = 0;
  __return_storage_ptr__->inode = 0;
  memset(&local_28,0,0x10);
  (__return_storage_ptr__->modTime).seconds = local_28;
  (__return_storage_ptr__->modTime).nanoseconds = local_20;
  (__return_storage_ptr__->modTime).seconds = 0;
  (__return_storage_ptr__->modTime).nanoseconds = 0;
  pFVar1 = std::
           unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
           ::operator->(&this->impl);
  (*pFVar1->_vptr_FileSystem[6])(&local_48,pFVar1,local_18);
  *(undefined8 *)(__return_storage_ptr__->checksum).bytes = local_48;
  *(undefined8 *)((__return_storage_ptr__->checksum).bytes + 8) = local_40;
  *(undefined8 *)((__return_storage_ptr__->checksum).bytes + 0x10) = local_38;
  *(undefined8 *)((__return_storage_ptr__->checksum).bytes + 0x18) = local_30;
  return __return_storage_ptr__;
}

Assistant:

virtual FileInfo getFileInfo(const std::string& path) override {
    auto info = impl->getFileInfo(path);

    info.device = 0;
    info.inode = 0;
    info.modTime = FileTimestamp();
    info.modTime.seconds = 0;
    info.modTime.nanoseconds = 0;

    info.checksum = impl->getFileChecksum(path);

    return info;
  }